

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaFile.cpp
# Opt level: O0

void __thiscall Imf_3_4::RgbaOutputFile::setYCRounding(RgbaOutputFile *this,uint roundY,uint roundC)

{
  uint in_EDX;
  uint in_ESI;
  lock_guard<std::mutex> *in_RDI;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffffd8;
  
  if (in_RDI[2]._M_device != (mutex_type *)0x0) {
    std::lock_guard<std::mutex>::lock_guard(in_RDI,in_stack_ffffffffffffffd8);
    ToYca::setYCRounding((ToYca *)in_RDI[2]._M_device,in_ESI,in_EDX);
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x220315);
  }
  return;
}

Assistant:

void
RgbaOutputFile::setYCRounding (unsigned int roundY, unsigned int roundC)
{
    if (_toYca)
    {
        std::lock_guard<std::mutex> lock (*_toYca);
        _toYca->setYCRounding (roundY, roundC);
    }
}